

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

i8 __thiscall idx2::DecodeTransformOrder(idx2 *this,u64 Input,v3i N3,str Output)

{
  int *piVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  idx2 *piVar6;
  idx2 *piVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  undefined8 local_10;
  int local_8;
  
  lVar5 = CONCAT44((int)((ulong)register0x00000008 >> 0x20),N3.field_0._8_4_);
  iVar4 = 1;
  iVar10 = 1;
  if ((int)Input != 0) {
    uVar9 = (long)(int)Input - 1;
    lVar2 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar10 = 1;
    if (uVar9 != 0) {
      iVar10 = (int)(1L << (-((byte)lVar2 ^ 0x3f) & 0x3f));
    }
  }
  local_10._4_4_ = (int)(Input >> 0x20);
  if ((long)local_10._4_4_ != 0) {
    uVar9 = (long)local_10._4_4_ - 1;
    lVar2 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar4 = 1;
    if (uVar9 != 0) {
      iVar4 = (int)(1L << (-((byte)lVar2 ^ 0x3f) & 0x3f));
    }
  }
  if (N3.field_0._0_4_ == 0) {
    local_8 = 1;
  }
  else {
    uVar9 = (long)N3.field_0._0_4_ - 1;
    lVar2 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    local_8 = 1;
    if (uVar9 != 0) {
      local_8 = (int)(1L << (-((byte)lVar2 ^ 0x3f) & 0x3f));
    }
  }
  local_10 = CONCAT44(iVar4,iVar10);
  cVar3 = '\0';
  uVar9 = (long)local_8 * (long)iVar4 * (long)iVar10;
  piVar7 = this;
  while (1 < uVar9) {
    uVar8 = (uint)piVar7 & 3;
    piVar6 = (idx2 *)((ulong)piVar7 >> 2);
    if (uVar8 == 3) {
      piVar7 = this;
      if (piVar6 != (idx2 *)0x3) {
        this = piVar6;
        piVar7 = piVar6;
      }
    }
    else {
      *(byte *)(lVar5 + cVar3) = (byte)uVar8 | 0x58;
      cVar3 = cVar3 + '\x01';
      piVar1 = (int *)((long)&local_10 + (ulong)((uint)piVar7 & 3) * 4);
      *piVar1 = *piVar1 >> 1;
      piVar7 = piVar6;
    }
    uVar9 = (long)local_8 * (long)local_10._4_4_ * (long)(int)local_10;
  }
  *(undefined1 *)(lVar5 + cVar3) = 0;
  return cVar3;
}

Assistant:

i8
DecodeTransformOrder(u64 Input, v3i N3, str Output)
{
  N3 = v3i((int)NextPow2(N3.X), (int)NextPow2(N3.Y), (int)NextPow2(N3.Z));
  i8 Len = 0;
  u64 SavedInput = Input;
  while (Prod<u64>(N3) > 1)
  {
    int T = Input & 0x3;
    Input >>= 2;
    if (T == 3)
    {
      if (Input == 3)
        Input = SavedInput;
      else
        SavedInput = Input;
    }
    else
    {
      Output[Len++] = char('X' + T);
      N3[T] >>= 1;
    }
  }
  Output[Len] = '\0';
  return Len;
}